

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_scalingFactorIncompatibleUnitsNoChecking_Test::TestBody
          (Units_scalingFactorIncompatibleUnitsNoChecking_Test *this)

{
  char *pcVar1;
  allocator<char> local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  AssertionResult gtest_ar;
  double local_80 [4];
  double local_60 [4];
  UnitsPtr oranges;
  UnitsPtr lemons;
  ModelPtr model;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"st_clements",(allocator<char> *)local_80);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"lemons",(allocator<char> *)local_80);
  libcellml::Units::create((string *)&lemons);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"metre",(allocator<char> *)&oranges);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"kilo",&local_a2);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"",&local_a3);
  libcellml::Units::addUnit
            ((string *)
             lemons.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&gtest_ar,1.0,1.0,(string *)local_80);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"oranges",(allocator<char> *)local_80);
  libcellml::Units::create((string *)&oranges);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"second",&local_a2);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"milli",&local_a3);
  pcVar1 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"",&local_a1);
  libcellml::Units::addUnit
            ((string *)
             oranges.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&gtest_ar,1.0,1.0,(string *)local_80);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_80[0] = 1000000.0;
  local_60[0] = (double)libcellml::Units::scalingFactor
                                  ((shared_ptr *)&oranges,(shared_ptr *)&lemons,false);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0E+6",
             "libcellml::Units::scalingFactor(oranges, lemons, false)",local_80,local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_80);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x9cc,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&oranges.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&lemons.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, scalingFactorIncompatibleUnitsNoChecking)
{
    // This test shows that a scaling factor can be returned for incompatible units
    // when compatibility checking is turned off.

    auto model = libcellml::Model::create("st_clements");
    auto lemons = libcellml::Units::create("lemons");
    lemons->addUnit("metre", "kilo");
    auto oranges = libcellml::Units::create("oranges");
    oranges->addUnit("second", "milli");
    model->addUnits(oranges);
    model->addUnits(lemons);

    EXPECT_EQ(1.0E+6, libcellml::Units::scalingFactor(oranges, lemons, false));
}